

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

int setup_roaring_add_offset_test(void **state_)

{
  size_t *psVar1;
  roaring_bitmap_t *prVar2;
  long *in_RDI;
  roaring_add_offset_test_case_t test;
  roaring_add_offset_test_state_t *state;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *file;
  char *expression;
  size_t result;
  
  psVar1 = (size_t *)*in_RDI;
  file = (char *)*psVar1;
  expression = (char *)psVar1[1];
  result = psVar1[2];
  prVar2 = roaring_bitmap_of_ptr
                     ((size_t)file,
                      (uint32_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  psVar1[4] = (size_t)prVar2;
  _assert_true(result,expression,file,in_stack_ffffffffffffffcc);
  return 0;
}

Assistant:

static int setup_roaring_add_offset_test(void **state_) {
    roaring_add_offset_test_state_t *state =
        *(roaring_add_offset_test_state_t **)state_;
    roaring_add_offset_test_case_t test = state->test_case;

    state->in = roaring_bitmap_of_ptr(test.n_values, test.values);
    assert_true(state->in != NULL);

    return 0;
}